

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  ostream *poVar1;
  Indent IVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string installedDir;
  string installedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_f8;
  string *local_d8;
  string local_d0;
  string local_98;
  pointer local_78;
  string *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  string local_50;
  
  local_d8 = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination(&local_50,local_d8);
  local_98._M_dataplus._M_p = (pointer)0xd;
  local_98._M_string_length = 0x7e8164;
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = local_50._M_string_length;
  local_78 = local_50._M_dataplus._M_p;
  local_d0.field_2._M_allocated_capacity = (long)&local_d0.field_2 + 8;
  local_d0._M_dataplus._M_p = (char *)0x0;
  local_d0._M_string_length = 1;
  local_d0.field_2._M_local_buf[8] = '/';
  local_68 = 1;
  local_58 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_98;
  local_70 = &local_50;
  local_60 = (undefined1 *)local_d0.field_2._M_allocated_capacity;
  cmCatViews(&local_f8,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)local_f8._M_string_length;
  local_98._M_string_length = (size_type)local_f8._M_dataplus._M_p;
  local_98.field_2._M_allocated_capacity = 0;
  local_78 = (this->FileName)._M_dataplus._M_p;
  local_98.field_2._8_8_ = (this->FileName)._M_string_length;
  local_70 = (string *)0x0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_98;
  cmCatViews(&local_d0,views_00);
  IVar2.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar2.Level = IVar2.Level + -1;
    } while (IVar2.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  iVar6 = indent.Level + 2;
  iVar3 = iVar6;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"file(DIFFERENT _cmake_export_file_changed FILES\n",0x30);
  iVar3 = iVar6;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"\n",2);
  iVar3 = iVar6;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"     \"",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->MainImportFile)._M_dataplus._M_p,
                      (this->MainImportFile)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  iVar3 = iVar6;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_export_file_changed)\n",0x1f);
  iVar4 = indent.Level + 4;
  iVar3 = iVar4;
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"file(GLOB _cmake_old_config_files \"",0x23)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
            (&local_98,
             (this->EFGen)._M_t.
             super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
             .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\")\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  iVar3 = iVar4;
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_old_config_files)\n",0x1c);
  iVar5 = indent.Level + 6;
  iVar3 = iVar5;
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,
             "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
             ,0x53);
  iVar3 = iVar5;
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"message(STATUS \"Old export file \\\"",0x22);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n"
             ,0x4a);
  iVar3 = iVar5;
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"unset(_cmake_old_config_files_text)\n",0x24);
  if (-6 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"file(REMOVE ${_cmake_old_config_files})\n",0x28);
  iVar3 = iVar4;
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if (-4 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"unset(_cmake_old_config_files)\n",0x1f);
  iVar3 = iVar6;
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  if (-2 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"unset(_cmake_export_file_changed)\n",0x22);
  IVar2.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar2.Level = IVar2.Level + -1;
    } while (IVar2.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98,&this->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,local_d8,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_98,false,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             (char *)0x0,indent,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = cmStrCat(
    "$ENV{DESTDIR}", ConvertToAbsoluteDestination(this->Destination), '/');
  std::string installedFile = cmStrCat(installedDir, this->FileName);
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(_cmake_export_file_changed)\n";
  os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(_cmake_old_config_files)\n";
  os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
  os << indentNNN << R"(message(STATUS "Old export file \")" << installedFile
     << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
  os << indentNNN << "unset(_cmake_old_config_files_text)\n";
  os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
  os << indentNN << "endif()\n";
  os << indentNN << "unset(_cmake_old_config_files)\n";
  os << indentN << "endif()\n";
  os << indentN << "unset(_cmake_export_file_changed)\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}